

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

bool __thiscall front::syntax::SyntaxAnalyze::match_one_word(SyntaxAnalyze *this,Token tk)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  const_reference this_00;
  ostream *poVar3;
  Function *pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Token in_ESI;
  char *in_RDI;
  bool return_value;
  Word *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string *name;
  Function *this_02;
  ostream *in_stack_fffffffffffffeb0;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [24];
  Timestamp *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  string local_e8 [96];
  Severity *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  time_point_sys_clock local_70;
  Timestamp local_68;
  undefined1 local_e;
  byte local_d;
  Token local_c;
  
  local_d = 0;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (*(long *)(in_RDI + 8) + 1);
  local_c = in_ESI;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<front::word::Word,_std::allocator<front::word::Word>_>::size
                     (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                       (in_RDI + 0x18));
  if (pbVar2 <= this_01) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
                  ,0x665,"bool front::syntax::SyntaxAnalyze::match_one_word(Token)");
  }
  this_00 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::operator[]
                      (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                        (in_RDI + 0x18),*(long *)(in_RDI + 8) + 1);
  bVar1 = word::Word::match_token(this_00,local_c);
  if (bVar1) {
    local_e = 0;
    AixLog::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pFVar4 = (Function *)&stack0xffffffffffffffc0;
    AixLog::Tag::Tag((Tag *)0x2a2293);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffffeb0,(Tag *)pFVar4);
    local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(&local_68,&local_70);
    AixLog::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    this_02 = (Function *)&stack0xffffffffffffff17;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,(allocator<char> *)poVar3);
    name = (string *)&local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,(allocator<char> *)poVar3);
    AixLog::Function::Function
              (this_02,name,in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    pFVar4 = (Function *)AixLog::operator<<(poVar3,pFVar4);
    std::vector<front::word::Word,_std::allocator<front::word::Word>_>::operator[]
              (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)(in_RDI + 0x18),
               *(long *)(in_RDI + 8) + 1);
    word::Word::get_self_abi_cxx11_(in_stack_fffffffffffffe78);
    poVar3 = std::operator<<((ostream *)pFVar4,local_138);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_138);
    AixLog::Function::~Function(pFVar4);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
    AixLog::Timestamp::~Timestamp(&local_68);
    AixLog::Tag::~Tag((Tag *)0x2a241e);
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    local_d = 1;
  }
  return (bool)(local_d & 1);
}

Assistant:

bool SyntaxAnalyze::match_one_word(Token tk) {
  bool return_value = false;
  if (matched_index + 1 < word_list.size()) {
    if (word_list[matched_index + 1].match_token(tk)) {
      LOG(TRACE) << word_list[matched_index + 1].get_self() << std::endl;
      matched_index++;
      return_value = true;
    }
  } else {
    assert(false);
  }
  return return_value;
}